

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

void __thiscall TokenField::saveXml(TokenField *this,ostream *s)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  
  std::operator<<(s,"<tokenfield");
  std::operator<<(s," bigendian=\"");
  pcVar3 = "false\"";
  pcVar2 = "false\"";
  if (this->bigendian != false) {
    pcVar2 = "true\"";
  }
  std::operator<<(s,pcVar2);
  std::operator<<(s," signbit=\"");
  if (this->signbit != false) {
    pcVar3 = "true\"";
  }
  std::operator<<(s,pcVar3);
  poVar1 = std::operator<<(s," bitstart=\"");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bitstart);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," bitend=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bitend);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," bytestart=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bytestart);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," byteend=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->byteend);
  std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(s," shift=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->shift);
  std::operator<<(poVar1,"\"/>\n");
  return;
}

Assistant:

void TokenField::saveXml(ostream &s) const

{
  s << "<tokenfield";
  s << " bigendian=\"";
  if (bigendian)
    s << "true\"";
  else
    s << "false\"";
  s << " signbit=\"";
  if (signbit)
    s << "true\"";
  else
    s << "false\"";
  s << " bitstart=\"" << dec << bitstart << "\"";
  s << " bitend=\"" << bitend << "\"";
  s << " bytestart=\"" << bytestart << "\"";
  s << " byteend=\"" << byteend << "\"";
  s << " shift=\"" << shift << "\"/>\n";
}